

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O3

uint __thiscall FVoxelModel::AddVertex(FVoxelModel *this,FModelVertex *vert,FVoxelMap *check)

{
  uint uVar1;
  FModelVertex *pFVar2;
  FModelVertex FVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Node *pNVar7;
  
  FVar3 = *vert;
  pNVar7 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::FindKey(check,*vert);
  if (pNVar7 == (Node *)0x0) {
    pNVar7 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::NewKey(check,FVar3);
    (pNVar7->Pair).Value = 0xffffffff;
  }
  else {
    uVar1 = (pNVar7->Pair).Value;
    if (uVar1 != 0xffffffff) {
      return uVar1;
    }
  }
  TArray<FModelVertex,_FModelVertex>::Grow(&this->mVertices,1);
  pFVar2 = (this->mVertices).Array;
  uVar1 = (this->mVertices).Count;
  pFVar2[uVar1].v = vert->v;
  fVar4 = vert->y;
  fVar5 = vert->z;
  fVar6 = vert->u;
  pFVar2 = pFVar2 + uVar1;
  pFVar2->x = vert->x;
  pFVar2->y = fVar4;
  pFVar2->z = fVar5;
  pFVar2->u = fVar6;
  uVar1 = (this->mVertices).Count;
  (this->mVertices).Count = uVar1 + 1;
  FVar3 = *vert;
  pNVar7 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::FindKey(check,*vert);
  if (pNVar7 == (Node *)0x0) {
    pNVar7 = TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::NewKey(check,FVar3);
    (pNVar7->Pair).Value = 0xffffffff;
  }
  (pNVar7->Pair).Value = uVar1;
  return uVar1;
}

Assistant:

unsigned int FVoxelModel::AddVertex(FModelVertex &vert, FVoxelMap &check)
{
	unsigned int index = check[vert];
	if (index == 0xffffffff)
	{
		index = check[vert] =mVertices.Push(vert);
	}
	return index;
}